

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

box3f * __thiscall
pbrt::TriangleMesh::getPrimBounds
          (box3f *__return_storage_ptr__,TriangleMesh *this,size_t primID,affine3f *xfm)

{
  vec3f vVar1;
  vec3f local_38;
  
  (__return_storage_ptr__->lower).x = 3.4028235e+38;
  (__return_storage_ptr__->lower).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->lower).z = 0xff7fffff7f7fffff;
  (__return_storage_ptr__->upper).y = -3.4028235e+38;
  (__return_storage_ptr__->upper).z = -3.4028235e+38;
  vVar1 = math::operator*(xfm,(this->vertex).
                              super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                              (this->index).
                              super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>
                              ._M_impl.super__Vector_impl_data._M_start[primID].x);
  local_38.z = vVar1.z;
  local_38._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_38);
  vVar1 = math::operator*(xfm,(this->vertex).
                              super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                              (this->index).
                              super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>
                              ._M_impl.super__Vector_impl_data._M_start[primID].y);
  local_38.z = vVar1.z;
  local_38._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_38);
  vVar1 = math::operator*(xfm,(this->vertex).
                              super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                              (this->index).
                              super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>
                              ._M_impl.super__Vector_impl_data._M_start[primID].z);
  local_38.z = vVar1.z;
  local_38._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_38);
  return __return_storage_ptr__;
}

Assistant:

box3f TriangleMesh::getPrimBounds(const size_t primID, const affine3f &xfm) 
  {
    box3f primBounds = box3f::empty_box();
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].x]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].y]));
    primBounds.extend(xfmPoint(xfm,vertex[index[primID].z]));
    return primBounds;
  }